

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1552.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  timeval tVar10;
  undefined8 uStack_40;
  int still_running;
  int num;
  
  _still_running = in_RAX;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar1 != 0) {
    uVar4 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                  ,0x2a,iVar1,uVar4);
    goto LAB_001014e5;
  }
  lVar5 = curl_multi_init();
  if (lVar5 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                  ,0x2c);
    iVar2 = 0x7b;
LAB_00101384:
    iVar1 = 0;
    lVar6 = 0;
  }
  else {
    lVar6 = curl_easy_init();
    if (lVar6 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                    ,0x2e);
      iVar2 = 0x7c;
      goto LAB_00101384;
    }
    iVar2 = curl_easy_setopt(lVar6,0x2712,URL);
    uVar9 = _stderr;
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar6,0x2a,1);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_easy_strerror(iVar2);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_40 = 0x31;
        goto LAB_001014b9;
      }
      iVar2 = curl_easy_setopt(lVar6,0x29,1);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_easy_strerror(iVar2);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_40 = 0x32;
        goto LAB_001014b9;
      }
      iVar2 = curl_easy_setopt(lVar6,0x2715,"u:s");
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_easy_strerror(iVar2);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_40 = 0x33;
        goto LAB_001014b9;
      }
      iVar2 = curl_multi_add_handle(lVar5,lVar6);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_multi_strerror(iVar2);
        pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_40 = 0x35;
        goto LAB_001014b9;
      }
      iVar2 = curl_multi_perform(lVar5,&still_running);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar4 = curl_multi_strerror(iVar2);
        pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_40 = 0x37;
        goto LAB_001014b9;
      }
      if (still_running < 0) {
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                      ,0x37);
        iVar2 = 0x7a;
LAB_00101629:
        iVar1 = 0;
      }
      else {
        tVar10 = tutil_tvnow();
        lVar7 = tutil_tvdiff(tVar10,tv_test_start);
        if (60000 < lVar7) {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                        ,0x39);
          iVar2 = 0x7d;
          goto LAB_00101629;
        }
        for (iVar1 = -3; (still_running != 0 && (iVar1 != 0)); iVar1 = iVar1 + 1) {
          iVar2 = curl_multi_wait(lVar5,0,0,60000,&num);
          if (iVar2 != 0) {
            curl_mprintf("curl_multi_wait() returned %d\n",iVar2);
            iVar3 = 0x7e;
            goto LAB_00101702;
          }
          tVar10 = tutil_tvnow();
          lVar7 = tutil_tvdiff(tVar10,tv_test_start);
          if (60000 < lVar7) {
            uStack_40 = 0x44;
LAB_001016f7:
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                          ,uStack_40);
            iVar3 = 0x7d;
            goto LAB_00101702;
          }
          iVar3 = curl_multi_perform(lVar5,&still_running);
          uVar9 = _stderr;
          if (iVar3 != 0) {
            uVar4 = curl_multi_strerror(iVar3);
            curl_mfprintf(uVar9,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                          ,0x46,iVar3,uVar4);
            goto LAB_00101702;
          }
          if (still_running < 0) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                          ,0x46);
            iVar3 = 0x7a;
            goto LAB_00101702;
          }
          tVar10 = tutil_tvnow();
          lVar7 = tutil_tvdiff(tVar10,tv_test_start);
          if (60000 < lVar7) {
            uStack_40 = 0x48;
            goto LAB_001016f7;
          }
        }
        lVar7 = curl_multi_info_read(lVar5,&still_running);
        iVar2 = 0;
        iVar3 = 0;
        if (lVar7 == 0) {
LAB_00101702:
          iVar2 = iVar3;
          iVar1 = 0;
        }
        else {
          iVar1 = *(int *)(lVar7 + 0x10);
        }
      }
    }
    else {
      uVar4 = curl_easy_strerror(iVar2);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_40 = 0x30;
LAB_001014b9:
      iVar1 = 0;
      curl_mfprintf(uVar9,pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1552.c"
                    ,uStack_40,iVar2,uVar4);
    }
  }
  curl_multi_cleanup(lVar5);
  curl_easy_cleanup(lVar6);
  curl_global_cleanup();
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
LAB_001014e5:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = 0;
  int res = 0;
  CURLMsg *msg;
  int counter = 3;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_USERPWD, "u:s");

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running && counter--) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}